

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

Function * __thiscall Function::setVerbose(Function *this,bool verbose,ostream *log)

{
  ostream *log_local;
  bool verbose_local;
  Function *this_local;
  
  this->bVerbose = verbose;
  this->oLog = log;
  if (this->xRight != (Function *)0x0) {
    setVerbose(this->xRight,verbose,log);
  }
  if (this->xLeft != (Function *)0x0) {
    setVerbose(this->xLeft,verbose,log);
  }
  if (this->xPlus != (Function *)0x0) {
    setVerbose(this->xPlus,verbose,log);
  }
  return this;
}

Assistant:

Function &Function::setVerbose(bool verbose, ostream *log)
{
		bVerbose = verbose;
		oLog = log;
		if (xRight) xRight->setVerbose(verbose, log);
		if (xLeft) xLeft->setVerbose(verbose, log);
		if (xPlus) xPlus->setVerbose(verbose, log);
		return *this;
}